

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanDebug.cpp
# Opt level: O2

VkBool32 VulkanUtilities::anon_unknown_0::DebugReportCallback
                   (VkDebugReportFlagsEXT flags,VkDebugReportObjectTypeEXT objectType,
                   uint64_t object,size_t location,int32_t messageCode,char *pLayerPrefix,
                   char *pMessage,void *pUserData)

{
  ostream *poVar1;
  char **Args;
  undefined1 uVar2;
  undefined8 local_1e8 [4];
  undefined8 local_1c8;
  string _msg;
  stringstream debugMessage;
  ostream local_190 [376];
  
  uVar2 = 2;
  if ((flags & 8) == 0) {
    uVar2 = (flags & 6) != 0;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&debugMessage);
  std::operator<<(local_190,"Vulkan debug message");
  if (pLayerPrefix != (char *)0x0) {
    poVar1 = std::operator<<(local_190," (");
    poVar1 = std::operator<<(poVar1,pLayerPrefix);
    std::operator<<(poVar1,")");
  }
  if (pMessage != (char *)0x0) {
    poVar1 = std::operator<<(local_190,": ");
    std::operator<<(poVar1,pMessage);
  }
  std::__cxx11::stringbuf::str();
  local_1c8 = local_1e8[0];
  Diligent::FormatString<char_const*>(&_msg,(Diligent *)&local_1c8,Args);
  std::__cxx11::string::~string((string *)local_1e8);
  if (Diligent::DebugMessageCallback != (undefined *)0x0) {
    (*(code *)Diligent::DebugMessageCallback)(uVar2,_msg._M_dataplus._M_p,0,0,0);
  }
  std::__cxx11::string::~string((string *)&_msg);
  std::__cxx11::stringstream::~stringstream((stringstream *)&debugMessage);
  return 0;
}

Assistant:

VkBool32 VKAPI_PTR DebugReportCallback(
    VkDebugReportFlagsEXT      flags,
    VkDebugReportObjectTypeEXT objectType,
    uint64_t                   object,       // the object where the issue was detected
    size_t                     location,     // a component (layer, driver, loader) defined value specifying the location of the trigger. This is an optional value.
    int32_t                    messageCode,  // is a layer-defined value indicating what test triggered this callback.
    const char*                pLayerPrefix, // a null-terminated string that is an abbreviation of the name of the component making the callback.
    const char*                pMessage,     // a null-terminated string detailing the trigger conditions.
    void*                      pUserData)
{
    auto MsgSeverity = DEBUG_MESSAGE_SEVERITY_INFO;
    if (flags & VK_DEBUG_REPORT_ERROR_BIT_EXT)
    {
        MsgSeverity = DEBUG_MESSAGE_SEVERITY_ERROR;
    }
    else if (flags & (VK_DEBUG_REPORT_WARNING_BIT_EXT | VK_DEBUG_REPORT_PERFORMANCE_WARNING_BIT_EXT))
    {
        MsgSeverity = DEBUG_MESSAGE_SEVERITY_WARNING;
    }
    else if (flags & (VK_DEBUG_REPORT_INFORMATION_BIT_EXT | VK_DEBUG_REPORT_DEBUG_BIT_EXT))
    {
        MsgSeverity = DEBUG_MESSAGE_SEVERITY_INFO;
    }

    std::stringstream debugMessage;
    debugMessage << "Vulkan debug message";
    if (pLayerPrefix != nullptr)
        debugMessage << " (" << pLayerPrefix << ")";

    if (pMessage != nullptr)
        debugMessage << ": " << pMessage;

    LOG_DEBUG_MESSAGE(MsgSeverity, debugMessage.str().c_str());

    // The callback returns a VkBool32, which is interpreted in a layer-specified manner.
    // The application should always return VK_FALSE. The VK_TRUE value is reserved for
    // use in layer development.
    return VK_FALSE;
}